

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::BinaryReader::BinaryReader(BinaryReader *this,istream *str)

{
  istream *piVar1;
  pointer puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  int32_t formatTag;
  int32_t tag;
  vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_> *local_50;
  uint64_t size;
  SP newEntity;
  
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = &this->readEntities;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->readEntities).
  super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->binStream = str;
  if (*(int *)(str + *(long *)(*(long *)str + -0x18) + 0x20) == 0) {
    std::istream::read((char *)str,(long)&formatTag);
    if (formatTag != 9) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Warning: pbf file uses a different format tag (");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      poVar3 = std::operator<<(poVar3,") than what this library is expecting (");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
      if (0xffff < (uint)formatTag) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "**** WARNING ***** : Even the *major* file format version is different - "
                                );
        poVar3 = std::operator<<(poVar3,
                                 "this means the file _should_ be incompatible with this library. ")
        ;
        poVar3 = std::operator<<(poVar3,"Please regenerate the pbf file.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    while( true ) {
      std::istream::read((char *)this->binStream,(long)&size);
      piVar1 = this->binStream;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) break;
      std::istream::read((char *)piVar1,(long)&tag);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->currentEntityData,size);
      std::istream::read((char *)this->binStream,
                         (long)(this->currentEntityData).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      this->currentEntityOffset = 0;
      createEntity((BinaryReader *)&newEntity,(int)this);
      std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
      push_back(local_50,(value_type *)&newEntity);
      if (newEntity.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(newEntity.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Entity[2])(newEntity.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,this);
      }
      puVar2 = (this->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->currentEntityData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newEntity.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid input stream - could not open file?");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryReader(std::istream &str)
      : binStream(str)
    {
      int32_t formatTag;
      if (!binStream.good())
        throw std::runtime_error("invalid input stream - could not open file?");
      binStream.read((char*)&formatTag,sizeof(formatTag));
      if (formatTag != ourFormatTag) {
        std::cout << "Warning: pbf file uses a different format tag ("
                  << ((int*)(size_t)formatTag) << ") than what this library is expecting ("
                  << ((int *)(size_t)ourFormatTag) << ")" << std::endl;
        int ourMajor = ourFormatTag >> 16;
        int fileMajor = formatTag >> 16;
        if (ourMajor != fileMajor)
          std::cout << "**** WARNING ***** : Even the *major* file format version is different - "
                    << "this means the file _should_ be incompatible with this library. "
                    << "Please regenerate the pbf file." << std::endl;
      }
      while (1) {
        uint64_t size;
        binStream.read((char*)&size,sizeof(size));
        if (!binStream.good())
          break;
        int32_t tag;
        binStream.read((char*)&tag,sizeof(tag));
        currentEntityData.resize(size);
        binStream.read((char *)currentEntityData.data(),size);
        currentEntityOffset = 0;

        Entity::SP newEntity = createEntity(tag);
        readEntities.push_back(newEntity);
        if (newEntity) newEntity->readFrom(*this);
        currentEntityData.clear();
      }
      // exit(0);
    }